

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpDef.cpp
# Opt level: O2

bool __thiscall Liby::http::RequestParser::ParseMethod(RequestParser *this,char *begin,char *end)

{
  int iVar1;
  iterator iVar2;
  string method;
  
  if (((end != (char *)0x0) && (begin != (char *)0x0)) && (begin <= end)) {
    method._M_dataplus._M_p = (pointer)&method.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&method);
    iVar2 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&methods_abi_cxx11_._M_h,&method);
    if (iVar2.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
        ._M_cur == (__node_type *)0x0) {
      iVar1 = 6;
    }
    else {
      (this->super_Request).method_ =
           *(int *)((long)iVar2.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                          ._M_cur + 0x28);
      iVar1 = 2;
    }
    this->progress_ = iVar1;
    std::__cxx11::string::~string((string *)&method);
    return iVar2.
           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
           ._M_cur != (__node_type *)0x0;
  }
  __assert_fail("begin <= end && begin && end",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/http/HttpDef.cpp"
                ,0xf6,"bool Liby::http::RequestParser::ParseMethod(const char *, const char *)");
}

Assistant:

bool RequestParser::ParseMethod(const char *begin, const char *end) {
    assert(begin <= end && begin && end);

    std::string method((begin), (end));
    auto it = methods.find(method);
    if (it == methods.end()) {
        progress_ = InvalidMethod;
        return false;
    } else {
        method_ = it->second;
        progress_ = ParsingURI;
        return true;
    }
}